

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O1

size_t zt_cstr_pos(char *s,ssize_t i)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = strlen(s);
  if (i < 0) {
    sVar2 = sVar1 - 1;
    if ((long)(i + sVar1) < (long)sVar1) {
      sVar2 = i + sVar1;
    }
  }
  else {
    sVar2 = sVar1 - 1;
    if (i < (long)sVar1) {
      sVar2 = i;
    }
  }
  return sVar2;
}

Assistant:

size_t
zt_cstr_pos(const char *s, ssize_t i) {
    size_t len;

    zt_assert(s);

    len = strlen(s);
    i   = (ssize_t)IDX(i, len);

    zt_assert(i >= 0 && (size_t)i <= len);
    return (size_t)i;
}